

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O2

void WI_Drawer(void)

{
  FFont *pFVar1;
  DFrameBuffer *pDVar2;
  float y;
  DFrameBuffer *string;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  EColorRange EVar7;
  level_info_t *plVar8;
  undefined4 extraout_var;
  undefined8 *puVar9;
  ulong uVar10;
  FTexture *pFVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DBot *pDVar14;
  uint x;
  int iVar15;
  uint uVar16;
  code *__compar;
  uint uVar17;
  uint uVar18;
  player_t *ppVar19;
  char *pcVar20;
  int iVar21;
  float fVar22;
  int iVar23;
  float x_00;
  ulong uVar24;
  int iVar25;
  long lVar26;
  int iStack_f0;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 uStack_e4;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  DFrameBuffer *pDStack_b0;
  BYTE *pBStack_a8;
  undefined8 uStack_a0;
  BYTE *pBStack_98;
  undefined8 uStack_90;
  uint uStack_88;
  undefined4 uStack_84;
  double dStack_80;
  undefined8 uStack_78;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  int iStack_5c;
  int iStack_58;
  int iStack_54;
  ulong uStack_50;
  ulong uStack_48;
  FTexture *pFStack_40;
  ulong uStack_38;
  
  if (state == LeavingIntermission) {
    return;
  }
  if (state == ShowNextLoc) {
    WI_drawBackground();
    if (splat != (FTexture *)0x0) {
      lVar26 = 8;
      for (uVar24 = 0; uVar24 < lnodes.Count; uVar24 = uVar24 + 1) {
        plVar8 = FindLevelInfo((lnodes.Array)->level + lVar26 + -8,true);
        if ((plVar8 != (level_info_t *)0x0) && ((int)plVar8->flags < 0)) {
          WI_drawOnLnode((int)uVar24,&splat,1);
        }
        lVar26 = lVar26 + 0x14;
      }
    }
    uVar16 = yah.Count;
    if ((snl_pointeron == true) && (yah.Count != 0)) {
      uVar18 = WI_MapToIndex((wbs->next).Chars);
      if (uVar18 < lnodes.Count) {
        WI_drawOnLnode(uVar18,yah.Array,uVar16);
      }
    }
    WI_drawEL();
    return;
  }
  if (state != StatCount) {
    snl_pointeron = true;
    WI_drawShowNextLoc();
    return;
  }
  if (deathmatch.Value != 0) {
    (*IntermissionFont->_vptr_FFont[3])(IntermissionFont,0x25);
    pFVar11 = FTextureManager::FindTexture(&TexMan,"READYICO",8,1);
    WI_drawBackground();
    iVar5 = WI_drawLF();
    HU_GetPlayerWidths((int *)((long)&uStack_b8 + 4),(int *)&uStack_88,(int *)((long)&uStack_90 + 4)
                      );
    iVar6 = FTexture::GetScaledHeight(pFVar11);
    uStack_a0 = pFVar11;
    iVar21 = FTexture::GetScaledTopOffset(pFVar11);
    iVar4 = iVar6 - iVar21;
    if (iVar6 - iVar21 <= uStack_90._4_4_) {
      iVar4 = uStack_90._4_4_;
    }
    uStack_90 = (BYTE *)CONCAT44(iVar4,(undefined4)uStack_90);
    uVar18 = SmallFont->FontHeight * CleanYfac;
    uVar16 = iVar4 * CleanYfac;
    if (iVar4 * CleanYfac < (int)uVar18) {
      uVar16 = uVar18;
    }
    iVar5 = iVar5 + CleanYfac;
    pBVar12 = (BYTE *)FStringTable::operator()(&GStrings,"SCORE_DEATHS");
    pBVar13 = (BYTE *)FStringTable::operator()(&GStrings,"SCORE_FRAGS");
    iVar4 = CleanXfac;
    iVar23 = (uStack_88 + 8) * CleanXfac;
    iVar6 = uStack_b8._4_4_;
    pDStack_b0 = (DFrameBuffer *)pBVar13;
    iVar3 = FFont::StringWidth(SmallFont,"XXXXX");
    iVar21 = FFont::StringWidth(SmallFont,pBVar13);
    if (iVar21 < iVar3) {
      iVar21 = iVar3;
    }
    iVar3 = (iVar6 + iVar21 + 8) * CleanXfac + iVar23;
    iVar6 = FFont::StringWidth(SmallFont,pBVar12);
    pDVar2 = screen;
    pFVar1 = SmallFont;
    pBStack_a8 = (BYTE *)CONCAT44(extraout_var,iVar6);
    uVar17 = (iVar6 + 8) * CleanXfac + iVar3;
    pBStack_98 = (BYTE *)(ulong)uVar17;
    x = (int)((screen->super_DSimpleCanvas).super_DCanvas.Width - uVar17) >> 1;
    iVar23 = iVar23 + x;
    iVar3 = iVar3 + x;
    iVar21 = x + uVar17;
    iVar25 = (uint)(((undefined1)gameinfo.gametype & GAME_Raven) == GAME_Any) * 8 + 3;
    pcVar20 = FStringTable::operator()(&GStrings,"SCORE_NAME");
    DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,iVar25,iVar23,iVar5,pcVar20,0x40001393,1,0);
    string = pDStack_b0;
    pDVar2 = screen;
    pFVar1 = SmallFont;
    iVar6 = FFont::StringWidth(SmallFont,(BYTE *)pDStack_b0);
    DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,iVar25,iVar3 - iVar6 * CleanXfac,iVar5,(char *)string
                      ,0x40001393,1,0);
    DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar25,iVar21 - (int)pBStack_a8 * CleanXfac,iVar5,
                      (char *)pBVar12,0x40001393,1,0);
    puVar9 = &players;
    for (lVar26 = 0; lVar26 != 8; lVar26 = lVar26 + 1) {
      (&uStack_78)[lVar26] = puVar9;
      puVar9 = puVar9 + 0x54;
    }
    iStack_f0 = (int)((uVar16 - uVar18) + 1) / 2;
    if (teamplay.Value == false) {
      __compar = comparepoints;
    }
    else {
      __compar = compareteams;
    }
    iVar5 = iVar5 + uVar18 + CleanYfac * 6;
    qsort(&uStack_78,8,8,__compar);
    lVar26 = 0;
    do {
      pDVar2 = screen;
      pFVar1 = SmallFont;
      if (lVar26 == 8) {
        iVar4 = iVar5 + uVar18 + CleanYfac * 3;
        EVar7 = (uint)(((undefined1)gameinfo.gametype & GAME_Raven) == GAME_Any) * 8 + CR_GREEN;
        pcVar20 = FStringTable::operator()(&GStrings,"SCORE_TOTAL");
        DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,EVar7,iVar23,iVar4,pcVar20,0x40001393,1,0);
        WI_drawNum(SmallFont,iVar3,iVar4,total_frags,0,false,EVar7);
        if (3 < ng_state) {
          WI_drawNum(SmallFont,iVar21,iVar4,total_deaths,0,false,EVar7);
        }
        iVar5 = iVar4 + uVar18 + CleanYfac;
        iVar4 = plrs[me].stime;
        pcVar20 = FStringTable::operator()(&GStrings,"SCORE_LVLTIME");
        FString::FString((FString *)&stack0xffffffffffffff18,pcVar20);
        FString::operator+=((FString *)&stack0xffffffffffffff18,": ");
        uVar10 = ((long)iVar4 * 0x62) / 0xdac;
        uVar16 = (int)uVar10 >> 0x1f;
        uVar24 = (ulong)uVar16 << 0x20 | uVar10 & 0xffffffff;
        mysnprintf((char *)((long)&uStack_84 + 3),9,"%02i:%02i:%02i",
                   (long)uVar24 / 0xe10 & 0xffffffff,
                   (ulong)(uint)(int)(short)((short)((long)uVar24 % 0xe10) / 0x3c),
                   (long)((ulong)uVar16 << 0x20 | uVar10 & 0xffffffff) % 0x3c & 0xffffffff);
        FString::operator+=((FString *)&stack0xffffffffffffff18,(char *)((long)&uStack_84 + 3));
        DCanvas::DrawText((DCanvas *)screen,SmallFont,EVar7,x,iVar5,
                          (char *)CONCAT44(uStack_e4,in_stack_ffffffffffffff18),0x40001393,1,0);
        FString::~FString((FString *)&stack0xffffffffffffff18);
        return;
      }
      ppVar19 = (player_t *)(&uStack_78)[lVar26];
      iVar6 = (int)((long)&ppVar19[-0x916e].morphTics / 0x2a0);
      if (playeringame[iVar6] == true) {
        D_GetPlayerColor(iVar6,(float *)&uStack_b8,(float *)((long)&uStack_c0 + 4),
                         (float *)&uStack_c0,(FPlayerColorSet **)0x0);
        HSVtoRGB(&fStack_c4,&fStack_c8,&fStack_cc,(float)uStack_b8,uStack_c0._4_4_,(float)uStack_c0)
        ;
        iVar25 = (int)(fStack_c4 * 255.0);
        if (0xfe < iVar25) {
          iVar25 = 0xff;
        }
        if (iVar25 < 1) {
          iVar25 = 0;
        }
        iVar15 = (int)(fStack_c8 * 255.0);
        if (0xfe < iVar15) {
          iVar15 = 0xff;
        }
        if (iVar15 < 1) {
          iVar15 = 0;
        }
        uVar17 = (uint)(fStack_cc * 255.0);
        if (0xfe < (int)uVar17) {
          uVar17 = 0xff;
        }
        if ((int)uVar17 < 1) {
          uVar17 = 0;
        }
        (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
                  (0x3f4ccccd,screen,(ulong)(uVar17 | iVar15 << 8 | iVar25 << 0x10),(ulong)x,
                   (ulong)(uint)(iVar5 - iStack_f0),(ulong)(uint)((int)pBStack_98 + CleanXfac * 8),
                   (ulong)uVar16);
        if (playerready[iVar6] == false) {
          pDVar14 = GC::ReadBarrier<DBot>((DBot **)&ppVar19->Bot);
          if (pDVar14 != (DBot *)0x0) goto LAB_00493b6e;
        }
        else {
LAB_00493b6e:
          DCanvas::DrawTexture
                    ((DCanvas *)screen,uStack_a0,
                     (double)(int)(x - (uint)uStack_a0->Width * CleanXfac),(double)iVar5,0x40001393,
                     1,0);
        }
        EVar7 = HU_GetRowColor(ppVar19,consoleplayer == iVar6);
        uVar17 = (ppVar19->mo->ScoreIcon).texnum;
        if (0 < (long)(int)uVar17) {
          if (uVar17 < TexMan.Textures.Count) {
            pFVar11 = TexMan.Textures.Array[(int)uVar17].Texture;
          }
          else {
            pFVar11 = (FTexture *)0x0;
          }
          DCanvas::DrawTexture
                    ((DCanvas *)screen,pFVar11,(double)(int)(x + iVar4 * 8),(double)iVar5,0x40001393
                     ,1,0);
        }
        pDVar2 = screen;
        pFVar1 = SmallFont;
        iVar25 = iVar5 + iStack_f0;
        pcVar20 = userinfo_t::GetName(&ppVar19->userinfo);
        DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,EVar7,iVar23,iVar25,pcVar20,0x40001393,1,0);
        WI_drawNum(SmallFont,iVar3,iVar25,cnt_frags[iVar6],0,false,EVar7);
        if (1 < ng_state) {
          WI_drawNum(SmallFont,iVar21,iVar25,cnt_deaths[iVar6],0,false,EVar7);
        }
        iVar5 = iVar5 + uVar16 + CleanYfac;
      }
      lVar26 = lVar26 + 1;
    } while( true );
  }
  if (!multiplayer) {
    WI_drawStats();
    return;
  }
  (*IntermissionFont->_vptr_FFont[3])(IntermissionFont,0x25);
  pFVar11 = FTextureManager::FindTexture(&TexMan,"READYICO",8,1);
  WI_drawBackground();
  iVar4 = WI_drawLF();
  HU_GetPlayerWidths(&iStack_54,&iStack_58,&iStack_5c);
  iVar5 = FTexture::GetScaledHeight(pFVar11);
  pFStack_40 = pFVar11;
  iVar6 = FTexture::GetScaledTopOffset(pFVar11);
  if (iStack_5c < iVar5 - iVar6) {
    iStack_5c = iVar5 - iVar6;
  }
  uStack_88 = SmallFont->FontHeight * CleanYfac;
  uStack_84 = iStack_5c * CleanYfac;
  if (iStack_5c * CleanYfac < (int)uStack_88) {
    uStack_84 = uStack_88;
  }
  uStack_48 = (long)(int)((uStack_84 - uStack_88) + 1) / 2 & 0xffffffff;
  uStack_b8 = (player_t *)CONCAT44(uStack_b8._4_4_,iVar4 + CleanYfac);
  pcVar20 = "SCORE_BONUS";
  if (((undefined1)gameinfo.gametype & GAME_Raven) == GAME_Any) {
    pcVar20 = "SCORE_ITEMS";
  }
  pBVar12 = (BYTE *)FStringTable::operator()(&GStrings,pcVar20);
  pBStack_98 = pBVar12;
  uStack_90 = (BYTE *)FStringTable::operator()(&GStrings,"SCORE_SECRET");
  pBVar13 = (BYTE *)FStringTable::operator()(&GStrings,"SCORE_KILLS");
  uStack_c0 = (double)(ulong)(uint)CleanXfac;
  iVar6 = (iStack_58 + 8) * CleanXfac;
  pBStack_a8 = pBVar13;
  iVar5 = FFont::StringWidth(SmallFont,"XXXXX");
  iVar4 = FFont::StringWidth(SmallFont,pBVar13);
  if (iVar4 < iVar5) {
    iVar4 = iVar5;
  }
  iVar21 = (iStack_54 + iVar4 + 8) * CleanXfac + iVar6;
  iVar4 = FFont::StringWidth(SmallFont,pBVar12);
  dStack_80 = (double)CONCAT44(extraout_var_00,iVar4);
  iVar5 = (iVar4 + 8) * CleanXfac + iVar21;
  uStack_a0._0_4_ = FFont::StringWidth(SmallFont,uStack_90);
  pDVar2 = screen;
  pFVar1 = SmallFont;
  uVar16 = ((int)uStack_a0 + 8) * CleanXfac + iVar5;
  uStack_38 = (ulong)uVar16;
  uVar18 = (int)((screen->super_DSimpleCanvas).super_DCanvas.Width - uVar16) >> 1;
  uStack_50 = (ulong)uVar18;
  uStack_c0 = (double)CONCAT44(uStack_c0._4_4_,uVar18 + SUB84(uStack_c0,0) * 8);
  x_00 = (float)(iVar6 + uVar18);
  fVar22 = (float)(iVar21 + uVar18);
  iVar5 = iVar5 + uVar18;
  fStack_cc = (float)(uVar18 + uVar16);
  iVar6 = (uint)(((undefined1)gameinfo.gametype & GAME_Raven) == GAME_Any) * 8 + 3;
  uStack_a0._4_4_ = extraout_var_01;
  pcVar20 = FStringTable::operator()(&GStrings,"SCORE_NAME");
  y = (float)uStack_b8;
  fStack_c4 = x_00;
  DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,iVar6,(int)x_00,(int)(float)uStack_b8,pcVar20,
                    0x40001393);
  pBVar12 = pBStack_a8;
  pFVar1 = SmallFont;
  pDStack_b0 = screen;
  iVar4 = FFont::StringWidth(SmallFont,pBStack_a8);
  fStack_c8 = fVar22;
  DCanvas::DrawText((DCanvas *)pDStack_b0,pFVar1,iVar6,(int)fVar22 - iVar4 * CleanXfac,(int)y,
                    (char *)pBVar12,0x40001393);
  pBStack_a8 = (BYTE *)CONCAT44(pBStack_a8._4_4_,iVar5);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar6,iVar5 - SUB84(dStack_80,0) * CleanXfac,(int)y,
                    (char *)pBStack_98,0x40001393);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar6,(int)fStack_cc - (int)uStack_a0 * CleanXfac,
                    (int)y,(char *)uStack_90,0x40001393);
  pBVar12 = (BYTE *)(ulong)(CleanYfac * 6 + (int)y + uStack_88);
  pBStack_98 = (BYTE *)CONCAT44(pBStack_98._4_4_,wbs->maxkills);
  uStack_a0 = (FTexture *)CONCAT44(uStack_a0._4_4_,wbs->maxitems);
  pDStack_b0 = (DFrameBuffer *)CONCAT44(pDStack_b0._4_4_,wbs->maxsecret);
  dStack_80 = (double)(int)(float)uStack_c0;
  ppVar19 = (player_t *)&players;
  lVar26 = 0;
  uVar24 = 0;
  iVar4 = CleanYfac;
  do {
    pDVar2 = screen;
    pFVar1 = SmallFont;
    iVar5 = (int)pBVar12;
    if (uVar24 == 8) {
      iVar5 = iVar4 * 3 + iVar5;
      pcVar20 = FStringTable::operator()(&GStrings,"SCORE_MISSED");
      DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,0x14,(int)fStack_c4,iVar5,pcVar20,0x40001393);
      WI_drawPercent(SmallFont,(int)fStack_c8,iVar5,(int)pBStack_98,wbs->maxkills,false,CR_DARKGRAY)
      ;
      if (3 < ng_state) {
        WI_drawPercent(SmallFont,(int)pBStack_a8,iVar5,(int)uStack_a0,wbs->maxitems,false,
                       CR_DARKGRAY);
        if (5 < ng_state) {
          WI_drawPercent(SmallFont,(int)fStack_cc,iVar5,(int)pDStack_b0,wbs->maxsecret,false,
                         CR_DARKGRAY);
        }
      }
      pDVar2 = screen;
      pFVar1 = SmallFont;
      iVar4 = iVar5 + uStack_88 + CleanYfac * 3;
      EVar7 = (uint)(((undefined1)gameinfo.gametype & GAME_Raven) == GAME_Any) * 8 + CR_GREEN;
      pcVar20 = FStringTable::operator()(&GStrings,"SCORE_TOTAL");
      DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,EVar7,(int)fStack_c4,iVar4,pcVar20,0x40001393);
      WI_drawNum(SmallFont,(int)fStack_c8,iVar4,wbs->maxkills,0,false,EVar7);
      if (3 < ng_state) {
        WI_drawNum(SmallFont,(int)pBStack_a8,iVar4,wbs->maxitems,0,false,EVar7);
        if (5 < ng_state) {
          WI_drawNum(SmallFont,(int)fStack_cc,iVar4,wbs->maxsecret,0,false,EVar7);
        }
      }
      return;
    }
    if (playeringame[uVar24] == true) {
      D_GetPlayerColor((int)uVar24,&fStack_60,&fStack_64,&fStack_68,(FPlayerColorSet **)0x0);
      HSVtoRGB(&fStack_6c,&fStack_70,(float *)((long)&uStack_78 + 4),fStack_60,fStack_64,fStack_68);
      iVar4 = (int)(fStack_6c * 255.0);
      if (0xfe < iVar4) {
        iVar4 = 0xff;
      }
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      iVar6 = (int)(fStack_70 * 255.0);
      if (0xfe < iVar6) {
        iVar6 = 0xff;
      }
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      uVar16 = (uint)(uStack_78._4_4_ * 255.0);
      if (0xfe < (int)uVar16) {
        uVar16 = 0xff;
      }
      if ((int)uVar16 < 1) {
        uVar16 = 0;
      }
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
                (0x3f4ccccd,screen,(ulong)(iVar6 << 8 | iVar4 << 0x10 | uVar16),uStack_50,
                 (ulong)(uint)(iVar5 - (int)uStack_48),(ulong)(uint)((int)uStack_38 + CleanXfac * 8)
                 ,(ulong)uStack_84);
      uStack_c0 = (double)iVar5;
      if (playerready[uVar24] == false) {
        pDVar14 = GC::ReadBarrier<DBot>((DBot **)&ppVar19->Bot);
        if (pDVar14 != (DBot *)0x0) goto LAB_0049496f;
      }
      else {
LAB_0049496f:
        DCanvas::DrawTexture
                  ((DCanvas *)screen,pFStack_40,
                   (double)(int)((int)uStack_50 - (uint)pFStack_40->Width * CleanXfac),uStack_c0,
                   0x40001393,1,0);
      }
      uStack_90 = pBVar12;
      EVar7 = HU_GetRowColor(ppVar19,uVar24 == (uint)consoleplayer);
      uVar16 = (ppVar19->mo->ScoreIcon).texnum;
      uStack_b8 = ppVar19;
      if (0 < (long)(int)uVar16) {
        if (uVar16 < TexMan.Textures.Count) {
          pFVar11 = TexMan.Textures.Array[(int)uVar16].Texture;
        }
        else {
          pFVar11 = (FTexture *)0x0;
        }
        DCanvas::DrawTexture((DCanvas *)screen,pFVar11,dStack_80,uStack_c0,0x40001393,1,0);
      }
      pDVar2 = screen;
      pFVar1 = SmallFont;
      iVar4 = (int)uStack_90 + (int)uStack_48;
      pcVar20 = userinfo_t::GetName(&uStack_b8->userinfo);
      DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,EVar7,(int)fStack_c4,iVar4,pcVar20,0x40001393);
      WI_drawPercent(SmallFont,(int)fStack_c8,iVar4,*(int *)((long)cnt_kills + lVar26),wbs->maxkills
                     ,false,EVar7);
      pBStack_98 = (BYTE *)CONCAT44(pBStack_98._4_4_,
                                    (int)pBStack_98 - *(int *)((long)cnt_kills + lVar26));
      if (3 < ng_state) {
        WI_drawPercent(SmallFont,(int)pBStack_a8,iVar4,*(int *)((long)cnt_items + lVar26),
                       wbs->maxitems,false,EVar7);
        uStack_a0 = (FTexture *)
                    CONCAT44(uStack_a0._4_4_,(int)uStack_a0 - *(int *)((long)cnt_items + lVar26));
        if (5 < ng_state) {
          WI_drawPercent(SmallFont,(int)fStack_cc,iVar4,*(int *)((long)cnt_secret + lVar26),
                         wbs->maxsecret,false,EVar7);
          pDStack_b0 = (DFrameBuffer *)
                       CONCAT44(pDStack_b0._4_4_,
                                (int)pDStack_b0 - *(int *)((long)cnt_secret + lVar26));
        }
      }
      pBVar12 = (BYTE *)(ulong)((int)uStack_90 + uStack_84 + CleanYfac);
      ppVar19 = uStack_b8;
      iVar4 = CleanYfac;
    }
    uVar24 = uVar24 + 1;
    lVar26 = lVar26 + 4;
    ppVar19 = ppVar19 + 1;
  } while( true );
}

Assistant:

void WI_Drawer (void)
{
	switch (state)
	{
	case StatCount:
		if (deathmatch)
			WI_drawDeathmatchStats();
		else if (multiplayer)
			WI_drawNetgameStats();
		else
			WI_drawStats();
		break;
	
	case ShowNextLoc:
		WI_drawShowNextLoc();
		break;
	
	case LeavingIntermission:
		break;

	default:
		WI_drawNoState();
		break;
	}
}